

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strxfrm.c
# Opt level: O1

int main(void)

{
  size_t sVar1;
  char s [12];
  char local_10 [16];
  
  builtin_strncpy(local_10,"xxxxxxxxxxx",0xc);
  sVar1 = strxfrm((char *)0x0,"123456789012",0);
  if (sVar1 != 0xc) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strxfrm.c, line %d - %s\n"
           ,0x29,"strxfrm( NULL, \"123456789012\", 0 ) == 12");
  }
  sVar1 = strxfrm(local_10,"123456789012",0xc);
  if (sVar1 != 0xc) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strxfrm.c, line %d - %s\n"
           ,0x2a,"strxfrm( s, \"123456789012\", 12 ) == 12");
  }
  sVar1 = strxfrm(local_10,"1234567890",0xb);
  if (sVar1 != 10) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strxfrm.c, line %d - %s\n"
           ,0x2f,"strxfrm( s, \"1234567890\", 11 ) == 10");
  }
  if (local_10[0] != '1') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strxfrm.c, line %d - %s\n"
           ,0x30,"s[0] == \'1\'");
  }
  if (local_10[9] != '0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strxfrm.c, line %d - %s\n"
           ,0x31,"s[9] == \'0\'");
  }
  if (local_10[10] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strxfrm.c, line %d - %s\n"
           ,0x32,"s[10] == \'\\0\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "xxxxxxxxxxx";
    TESTCASE( strxfrm( NULL, "123456789012", 0 ) == 12 );
    TESTCASE( strxfrm( s, "123456789012", 12 ) == 12 );
    /*
    The following test case is true in *this* implementation, but doesn't have to.
    TESTCASE( s[0] == 'x' );
    */
    TESTCASE( strxfrm( s, "1234567890", 11 ) == 10 );
    TESTCASE( s[0] == '1' );
    TESTCASE( s[9] == '0' );
    TESTCASE( s[10] == '\0' );
    return TEST_RESULTS;
}